

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O3

int ReadHuffmanCode(int alphabet_size,VP8LDecoder *dec,int *code_lengths,HuffmanTables *table)

{
  VP8LBitReader *br_00;
  int iVar1;
  byte bVar2;
  ushort uVar3;
  HuffmanCode *pHVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  uint *puVar12;
  VP8LBitReader *br;
  int iVar13;
  ulong uVar14;
  bool bVar15;
  HuffmanTables tables;
  int code_length_code_lengths [19];
  uint local_c4;
  HuffmanTables local_b0;
  uint32_t local_88 [22];
  
  br_00 = &dec->br;
  uVar5 = VP8LReadBits(br_00,1);
  memset(code_lengths,0,(long)alphabet_size << 2);
  if (uVar5 == 0) {
    local_88[0x10] = 0;
    local_88[0x11] = 0;
    local_88[0x12] = 0;
    local_88[0xc] = 0;
    local_88[0xd] = 0;
    local_88[0xe] = 0;
    local_88[0xf] = 0;
    local_88[8] = 0;
    local_88[9] = 0;
    local_88[10] = 0;
    local_88[0xb] = 0;
    local_88[4] = 0;
    local_88[5] = 0;
    local_88[6] = 0;
    local_88[7] = 0;
    local_88[0] = 0;
    local_88[1] = 0;
    local_88[2] = 0;
    local_88[3] = 0;
    uVar5 = VP8LReadBits(br_00,4);
    if (0 < (int)(uVar5 + 4)) {
      uVar14 = 0;
      do {
        uVar6 = VP8LReadBits(br_00,3);
        local_88["\x11\x12"[uVar14]] = uVar6;
        uVar14 = uVar14 + 1;
      } while (uVar5 + 4 != uVar14);
    }
    iVar9 = VP8LHuffmanTablesAllocate(0x80,&local_b0);
    if ((iVar9 == 0) ||
       (iVar9 = VP8LBuildHuffmanTable(&local_b0,7,(int *)local_88,0x13), iVar9 == 0)) {
LAB_0010d2ef:
      VP8LHuffmanTablesDeallocate(&local_b0);
      if ((dec->status == VP8_STATUS_SUSPENDED) || (dec->status == VP8_STATUS_OK)) {
        dec->status = VP8_STATUS_BITSTREAM_ERROR;
      }
      goto LAB_0010d40c;
    }
    uVar5 = VP8LReadBits(br_00,1);
    iVar9 = alphabet_size;
    if (uVar5 != 0) {
      uVar5 = VP8LReadBits(br_00,3);
      uVar5 = VP8LReadBits(br_00,uVar5 * 2 + 2);
      iVar9 = uVar5 + 2;
      if (alphabet_size < iVar9) goto LAB_0010d2ef;
    }
    if (0 < alphabet_size) {
      local_c4 = 8;
      iVar13 = 0;
      do {
        bVar15 = iVar9 == 0;
        iVar9 = iVar9 + -1;
        if (bVar15) break;
        iVar11 = (dec->br).bit_pos;
        if (0x1f < iVar11) {
          VP8LDoFillBitWindow(br_00);
          iVar11 = (dec->br).bit_pos;
        }
        pHVar4 = (local_b0.curr_segment)->start;
        uVar7 = (uint)((dec->br).val >> ((byte)iVar11 & 0x3f)) & 0x7f;
        (dec->br).bit_pos = (uint)pHVar4[uVar7].bits + iVar11;
        uVar3 = pHVar4[uVar7].value;
        if (uVar3 < 0x10) {
          lVar10 = (long)iVar13;
          iVar13 = iVar13 + 1;
          uVar7 = (uint)uVar3;
          code_lengths[lVar10] = uVar7;
          if (uVar7 != 0) {
            local_c4 = uVar7;
          }
        }
        else {
          bVar2 = "\x03\x03\v"[uVar3 - 0x10];
          uVar5 = VP8LReadBits(br_00,(uint)"\x02\x03\a"[uVar3 - 0x10]);
          iVar11 = uVar5 + bVar2;
          iVar1 = iVar11 + iVar13;
          if (alphabet_size < iVar1) goto LAB_0010d2ef;
          uVar7 = 0;
          if (uVar3 == 0x10) {
            uVar7 = local_c4;
          }
          if (0 < iVar11) {
            puVar12 = (uint *)(code_lengths + iVar13);
            uVar8 = uVar5 + bVar2 + 1;
            do {
              *puVar12 = uVar7;
              puVar12 = puVar12 + 1;
              uVar8 = uVar8 - 1;
              iVar13 = iVar1;
            } while (1 < uVar8);
          }
        }
      } while (iVar13 < alphabet_size);
    }
    VP8LHuffmanTablesDeallocate(&local_b0);
  }
  else {
    uVar5 = VP8LReadBits(br_00,1);
    uVar6 = VP8LReadBits(br_00,1);
    iVar9 = 8;
    if (uVar6 == 0) {
      iVar9 = 1;
    }
    uVar6 = VP8LReadBits(br_00,iVar9);
    code_lengths[(int)uVar6] = 1;
    if (uVar5 == 1) {
      uVar5 = VP8LReadBits(br_00,8);
      code_lengths[(int)uVar5] = 1;
    }
  }
  if (((dec->br).eos == 0) &&
     (iVar9 = VP8LBuildHuffmanTable(table,8,code_lengths,alphabet_size), iVar9 != 0)) {
    return iVar9;
  }
LAB_0010d40c:
  if ((dec->status == VP8_STATUS_SUSPENDED) || (dec->status == VP8_STATUS_OK)) {
    dec->status = VP8_STATUS_BITSTREAM_ERROR;
  }
  return 0;
}

Assistant:

static int ReadHuffmanCode(int alphabet_size, VP8LDecoder* const dec,
                           int* const code_lengths,
                           HuffmanTables* const table) {
  int ok = 0;
  int size = 0;
  VP8LBitReader* const br = &dec->br;
  const int simple_code = VP8LReadBits(br, 1);

  memset(code_lengths, 0, alphabet_size * sizeof(*code_lengths));

  if (simple_code) {  // Read symbols, codes & code lengths directly.
    const int num_symbols = VP8LReadBits(br, 1) + 1;
    const int first_symbol_len_code = VP8LReadBits(br, 1);
    // The first code is either 1 bit or 8 bit code.
    int symbol = VP8LReadBits(br, (first_symbol_len_code == 0) ? 1 : 8);
    code_lengths[symbol] = 1;
    // The second code (if present), is always 8 bits long.
    if (num_symbols == 2) {
      symbol = VP8LReadBits(br, 8);
      code_lengths[symbol] = 1;
    }
    ok = 1;
  } else {  // Decode Huffman-coded code lengths.
    int i;
    int code_length_code_lengths[NUM_CODE_LENGTH_CODES] = { 0 };
    const int num_codes = VP8LReadBits(br, 4) + 4;
    assert(num_codes <= NUM_CODE_LENGTH_CODES);

    for (i = 0; i < num_codes; ++i) {
      code_length_code_lengths[kCodeLengthCodeOrder[i]] = VP8LReadBits(br, 3);
    }
    ok = ReadHuffmanCodeLengths(dec, code_length_code_lengths, alphabet_size,
                                code_lengths);
  }

  ok = ok && !br->eos;
  if (ok) {
    size = VP8LBuildHuffmanTable(table, HUFFMAN_TABLE_BITS,
                                 code_lengths, alphabet_size);
  }
  if (!ok || size == 0) {
    return VP8LSetError(dec, VP8_STATUS_BITSTREAM_ERROR);
  }
  return size;
}